

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

shared_ptr<spdlog::logger> __thiscall spdlog::details::registry::default_logger(registry *this)

{
  long lVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pthread_mutex_t *in_RSI;
  shared_ptr<spdlog::logger> sVar3;
  
  iVar2 = pthread_mutex_lock(in_RSI);
  if (iVar2 == 0) {
    (this->logger_map_mutex_).super___mutex_base._M_mutex.__align = in_RSI[7].__align;
    lVar1 = *(long *)((long)in_RSI + 0x120);
    *(long *)((long)&(this->logger_map_mutex_).super___mutex_base._M_mutex + 8) = lVar1;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
    pthread_mutex_unlock(in_RSI);
    sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<spdlog::logger>)
           sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> registry::default_logger()
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    return default_logger_;
}